

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O3

qint64 __thiscall
QNativeSocketEngine::readDatagram
          (QNativeSocketEngine *this,char *data,qint64 maxSize,QIpPacketHeader *header,
          PacketHeaderOptions options)

{
  QNativeSocketEnginePrivate *this_00;
  char cVar1;
  qint64 qVar2;
  
  this_00 = *(QNativeSocketEnginePrivate **)(this + 8);
  cVar1 = (**(code **)(*(long *)this + 0x78))();
  if (cVar1 == '\0') {
    readDatagram();
  }
  else {
    if ((this_00->super_QAbstractSocketEnginePrivate).socketState - ConnectedState < 2) {
      qVar2 = QNativeSocketEnginePrivate::nativeReceiveDatagram(this_00,data,maxSize,header,options)
      ;
      return qVar2;
    }
    readDatagram();
  }
  return -1;
}

Assistant:

qint64 QNativeSocketEngine::readDatagram(char *data, qint64 maxSize, QIpPacketHeader *header,
                                         PacketHeaderOptions options)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::readDatagram(), -1);
    Q_CHECK_STATES(QNativeSocketEngine::readDatagram(), QAbstractSocket::BoundState,
                   QAbstractSocket::ConnectedState, -1);

    return d->nativeReceiveDatagram(data, maxSize, header, options);
}